

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O0

void __thiscall catalog::descTable(catalog *this,string *tableName)

{
  key_type kVar1;
  int iVar2;
  ostream *poVar3;
  reference ppTVar4;
  void *this_00;
  reference pvVar5;
  reference pvVar6;
  pointer ppVar7;
  _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  key_type local_50 [2];
  int j;
  string local_40 [36];
  int local_1c;
  string *psStack_18;
  int pos;
  string *tableName_local;
  catalog *this_local;
  
  psStack_18 = tableName;
  tableName_local = (string *)this;
  std::__cxx11::string::string(local_40,(string *)tableName);
  iVar2 = existTable(this,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  local_1c = iVar2;
  if (iVar2 < 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"no such table");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"tableName : ");
    ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                        (&this->TableInfoList,(long)local_1c);
    std::operator<<(poVar3,(string *)*ppTVar4);
    poVar3 = std::operator<<((ostream *)&std::cout,"\tattributeNum : ");
    ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                        (&this->TableInfoList,(long)local_1c);
    this_00 = (void *)std::ostream::operator<<(poVar3,(*ppTVar4)->attributeNum);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_50[0] = 0;
    while( true ) {
      kVar1 = local_50[0];
      ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                          (&this->TableInfoList,(long)local_1c);
      if ((*ppTVar4)->attributeNum <= kVar1) break;
      ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                          (&this->TableInfoList,(long)local_1c);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&(*ppTVar4)->attributeName,(long)local_50[0]);
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)pvVar5);
      poVar3 = std::operator<<(poVar3,"\t");
      ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                          (&this->TableInfoList,(long)local_1c);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(*ppTVar4)->type,(long)local_50[0]);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar6);
      poVar3 = std::operator<<(poVar3,"\t");
      ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                          (&this->TableInfoList,(long)local_1c);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(*ppTVar4)->constraint,(long)local_50[0]);
      std::ostream::operator<<(poVar3,*pvVar6);
      ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                          (&this->TableInfoList,(long)local_1c);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(*ppTVar4)->constraint,(long)local_50[0]);
      if (*pvVar6 == 3) {
        std::operator<<((ostream *)&std::cout,"\tprimary key ");
      }
      ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                          (&this->TableInfoList,(long)local_1c);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(*ppTVar4)->constraint,(long)local_50[0]);
      if (*pvVar6 == 4) {
        poVar3 = std::operator<<((ostream *)&std::cout,"\tindex ");
        ppTVar4 = std::vector<TableInfo_*,_std::allocator<TableInfo_*>_>::operator[]
                            (&this->TableInfoList,(long)local_1c);
        local_58._M_node =
             (_Base_ptr)
             std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&(*ppTVar4)->indexInfo,local_50);
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_58);
        std::operator<<(poVar3,(string *)&ppVar7->second);
      }
      std::operator<<((ostream *)&std::cout,"\n");
      local_50[0] = local_50[0] + 1;
    }
  }
  return;
}

Assistant:

void catalog::descTable(std::string tableName){
    int pos = existTable(tableName);
    if(pos < 0){
        std::cout<<"no such table"<<std::endl;
        return;
    }
    std::cout<<"tableName : "<<TableInfoList[pos]->tableName;
    std::cout<<"\tattributeNum : "<<TableInfoList[pos]->attributeNum<<std::endl;
    for(int j = 0 ; j < TableInfoList[pos]->attributeNum; j ++){
        std::cout<<TableInfoList[pos]->attributeName[j] << "\t"<<TableInfoList[pos]->type[j] << "\t"<<TableInfoList[pos]->constraint[j];
        if(TableInfoList[pos]->constraint[j] == 3)std::cout<<"\tprimary key ";
        if(TableInfoList[pos]->constraint[j] == 4)std::cout<<"\tindex "<<TableInfoList[pos]->indexInfo.find(j)->second;
        std::cout<<"\n";
    }

}